

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blob.c
# Opt level: O1

BLOB_RESULT
Blob_PutBlockList(HTTPAPIEX_HANDLE httpApiExHandle,char *relativePath,
                 SINGLYLINKEDLIST_HANDLE blockIDList,uint *httpStatus,BUFFER_HANDLE httpResponse)

{
  bool bVar1;
  int iVar2;
  HTTPAPIEX_RESULT HVar3;
  LOGGER_LOG p_Var4;
  LIST_ITEM_HANDLE pLVar5;
  STRING_HANDLE handle;
  STRING_HANDLE pSVar6;
  uchar *source;
  size_t size;
  BUFFER_HANDLE requestContent;
  char *pcVar7;
  BLOB_RESULT BVar8;
  uint httpResponseStatusCode;
  BUFFER_HANDLE local_48;
  HTTPAPIEX_HANDLE local_40;
  uint *local_38;
  
  if ((blockIDList == (SINGLYLINKEDLIST_HANDLE)0x0 ||
      (relativePath == (char *)0x0 || httpApiExHandle == (HTTPAPIEX_HANDLE)0x0)) ||
      httpStatus == (uint *)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 != (LOGGER_LOG)0x0) {
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_PutBlockList",0x112,1,
                "Invalid argument (httpApiExHandle=%p, relativePath=%p, blockIDList=%p, httpStatus=%p)"
                ,httpApiExHandle,relativePath,blockIDList,httpStatus);
      return BLOB_INVALID_ARG;
    }
    return BLOB_INVALID_ARG;
  }
  pLVar5 = singlylinkedlist_get_head_item(blockIDList);
  if (pLVar5 == (LIST_ITEM_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return BLOB_ERROR;
    }
    pcVar7 = "Block ID list is empty";
    iVar2 = 0x11a;
    goto LAB_00129a50;
  }
  local_38 = httpStatus;
  handle = STRING_construct("<?xml version=\"1.0\" encoding=\"utf-8\"?>\r\n<BlockList>");
  if (handle == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_0012999e:
      handle = (STRING_HANDLE)0x0;
    }
    else {
      handle = (STRING_HANDLE)0x0;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"createBlockIdListXml",0x25,1,"failed opening Block ID List XML");
    }
  }
  else {
    local_48 = httpResponse;
    local_40 = httpApiExHandle;
    pLVar5 = singlylinkedlist_get_head_item(blockIDList);
    do {
      if (pLVar5 == (LIST_ITEM_HANDLE)0x0) break;
      pSVar6 = (STRING_HANDLE)singlylinkedlist_item_get_value(pLVar5);
      iVar2 = STRING_concat(handle,"<Latest>");
      if (((iVar2 == 0) && (iVar2 = STRING_concat_with_STRING(handle,pSVar6), iVar2 == 0)) &&
         (iVar2 = STRING_concat(handle,"</Latest>"), iVar2 == 0)) {
        pLVar5 = singlylinkedlist_get_next_item(pLVar5);
        bVar1 = true;
      }
      else {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                    ,"createBlockIdListXml",0x35,1,"failed to concatenate Block ID to XML");
        }
        STRING_delete(handle);
        bVar1 = false;
        handle = (STRING_HANDLE)0x0;
      }
    } while (bVar1);
    if (handle == (STRING_HANDLE)0x0) {
      handle = (STRING_HANDLE)0x0;
      httpApiExHandle = local_40;
      httpResponse = local_48;
    }
    else {
      iVar2 = STRING_concat(handle,"</BlockList>");
      httpApiExHandle = local_40;
      httpResponse = local_48;
      if (iVar2 != 0) {
        p_Var4 = xlogging_get_log_function();
        if (p_Var4 != (LOGGER_LOG)0x0) {
          (*p_Var4)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                    ,"createBlockIdListXml",0x41,1,"failed closing Block ID List XML");
        }
        STRING_delete(handle);
        goto LAB_0012999e;
      }
    }
  }
  if (handle == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return BLOB_ERROR;
    }
    pcVar7 = "failed creating Block ID list XML";
    iVar2 = 0x124;
LAB_00129a50:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
              ,"Blob_PutBlockList",iVar2,1,pcVar7);
    return BLOB_ERROR;
  }
  pSVar6 = STRING_construct(relativePath);
  if (pSVar6 == (STRING_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
      BVar8 = BLOB_ERROR;
    }
    else {
      BVar8 = BLOB_ERROR;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_PutBlockList",0x12d,1,"failed to STRING_construct");
    }
    goto LAB_00129be3;
  }
  iVar2 = STRING_concat(pSVar6,"&comp=blocklist");
  if (iVar2 == 0) {
    source = (uchar *)STRING_c_str(handle);
    size = STRING_length(handle);
    requestContent = BUFFER_create(source,size);
    if (requestContent == (BUFFER_HANDLE)0x0) {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 == (LOGGER_LOG)0x0) goto LAB_00129b7d;
      pcVar7 = "failed to BUFFER_create";
      iVar2 = 0x13f;
      goto LAB_00129a11;
    }
    httpResponseStatusCode = 0;
    pcVar7 = STRING_c_str(pSVar6);
    BVar8 = BLOB_HTTP_ERROR;
    HVar3 = HTTPAPIEX_ExecuteRequest
                      (httpApiExHandle,HTTPAPI_REQUEST_PUT,pcVar7,(HTTP_HEADERS_HANDLE)0x0,
                       requestContent,&httpResponseStatusCode,(HTTP_HEADERS_HANDLE)0x0,httpResponse)
    ;
    if ((HVar3 == HTTPAPIEX_OK) && (httpResponseStatusCode - 100 < 200)) {
      BVar8 = BLOB_OK;
      singlylinkedlist_remove_if(blockIDList,removeAndDestroyBlockIdInList,(void *)0x0);
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                  ,"Blob_PutBlockList",0x151,1,
                  "unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)",
                  (ulong)httpResponseStatusCode);
      }
    }
    *local_38 = httpResponseStatusCode;
    BUFFER_delete(requestContent);
  }
  else {
    p_Var4 = xlogging_get_log_function();
    if (p_Var4 == (LOGGER_LOG)0x0) {
LAB_00129b7d:
      BVar8 = BLOB_ERROR;
    }
    else {
      pcVar7 = "failed to STRING_concat";
      iVar2 = 0x134;
LAB_00129a11:
      BVar8 = BLOB_ERROR;
      (*p_Var4)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/blob.c"
                ,"Blob_PutBlockList",iVar2,1,pcVar7);
    }
  }
  STRING_delete(pSVar6);
LAB_00129be3:
  STRING_delete(handle);
  return BVar8;
}

Assistant:

BLOB_RESULT Blob_PutBlockList(
    HTTPAPIEX_HANDLE httpApiExHandle,
    const char* relativePath,
    SINGLYLINKEDLIST_HANDLE blockIDList,
    unsigned int* httpStatus,
    BUFFER_HANDLE httpResponse)
{
    BLOB_RESULT result;

    if (httpApiExHandle == NULL || relativePath == NULL || blockIDList == NULL || httpStatus == NULL)
    {
        LogError("Invalid argument (httpApiExHandle=%p, relativePath=%p, blockIDList=%p, httpStatus=%p)",
            httpApiExHandle, relativePath, blockIDList, httpStatus);
            result = BLOB_INVALID_ARG;
    }
    else if (singlylinkedlist_get_head_item(blockIDList) == NULL)
    {
        // Block ID List is empty, there is nothing to be be sent to Azure Blob Storage.
        // In this case we better return error, forcing the caller to call this function only
        // if at least one call to Blob_PutBlock() succeeds.
        LogError("Block ID list is empty");
        result = BLOB_ERROR;
    }
    else
    {
        STRING_HANDLE blockIdListXml = createBlockIdListXml(blockIDList);
        
        /*complete the XML*/
        if (blockIdListXml == NULL)
        {
            LogError("failed creating Block ID list XML");
            result = BLOB_ERROR;
        }
        else
        {
            STRING_HANDLE newRelativePath = STRING_construct(relativePath);

            if (newRelativePath == NULL)
            {
                LogError("failed to STRING_construct");
                result = BLOB_ERROR;
            }
            else
            {
                if (STRING_concat(newRelativePath, blockListUriMarker) != 0)
                {
                    LogError("failed to STRING_concat");
                    result = BLOB_ERROR;
                }
                else
                {
                    const char* blockIdListXmlCharPtr = STRING_c_str(blockIdListXml);
                    size_t blockIdListXmlLength = STRING_length(blockIdListXml);
                    BUFFER_HANDLE blockIDListAsBuffer = BUFFER_create((const unsigned char*)blockIdListXmlCharPtr, blockIdListXmlLength);

                    if (blockIDListAsBuffer == NULL)
                    {
                        LogError("failed to BUFFER_create");
                        result = BLOB_ERROR;
                    }
                    else
                    {
                        unsigned int httpResponseStatusCode = 0;

                        if (HTTPAPIEX_ExecuteRequest(
                                httpApiExHandle,
                                HTTPAPI_REQUEST_PUT,
                                STRING_c_str(newRelativePath),
                                NULL,
                                blockIDListAsBuffer,
                                &httpResponseStatusCode,
                                NULL,
                                httpResponse) != HTTPAPIEX_OK ||
                                !IS_HTTP_STATUS_CODE_SUCCESS(httpResponseStatusCode))
                        {
                            LogError("unable to HTTPAPIEX_ExecuteRequest (HTTP response status %u)", httpResponseStatusCode);
                            result = BLOB_HTTP_ERROR;
                        }
                        else
                        {
                            (void)singlylinkedlist_remove_if(blockIDList, removeAndDestroyBlockIdInList, NULL);
                            result = BLOB_OK;
                        }

                        if (httpStatus != NULL)
                        {
                            *httpStatus = httpResponseStatusCode;
                        }
                        
                        BUFFER_delete(blockIDListAsBuffer);
                    }
                }
                STRING_delete(newRelativePath);
            }

            STRING_delete(blockIdListXml);
        }
    }

    return result;
}